

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lm_trie.c
# Opt level: O2

void lm_trie_build(lm_trie_t *trie,ngram_raw_t **raw_ngrams,uint32 *counts,uint32 *out_counts,
                  int order)

{
  uint32 *puVar1;
  int *piVar2;
  float32 prob;
  ngram_raw_t *pnVar3;
  unigram_t *puVar4;
  longest_t *plVar5;
  uint8 *puVar6;
  undefined8 uVar7;
  ngram_raw_t **ppnVar8;
  int iVar9;
  priority_queue_t *ppVar10;
  float *ptr;
  long *plVar11;
  undefined8 *element;
  middle_t *middle;
  uint uVar12;
  int order_00;
  long extraout_RDX;
  ulong uVar13;
  middle_t *pmVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  size_t sVar18;
  bool bVar19;
  float prob_00;
  bitarr_address_t bVar20;
  bitarr_address_t address;
  uint local_84;
  ulong local_80;
  uint32 *local_78;
  uint *local_70;
  void *local_68;
  priority_queue_t *local_60;
  ulong local_58;
  uint32 local_4c;
  ngram_raw_t **local_48;
  ulong local_40;
  long local_38;
  
  local_78 = counts;
  lm_trie_fix_counts(raw_ngrams,counts,out_counts,order);
  lm_trie_alloc_ngram(trie,out_counts,order);
  local_80 = (ulong)(uint)order;
  if (1 < order) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
            ,0x20a,"Training quantizer\n");
  }
  sVar18 = (size_t)(int)local_80;
  for (lVar17 = 2; puVar1 = local_78, lVar17 < (long)sVar18; lVar17 = lVar17 + 1) {
    lm_trie_quant_train(trie->quant,(int)lVar17,local_78[lVar17 + -1],raw_ngrams[lVar17 + -2]);
  }
  iVar9 = (int)local_80;
  lm_trie_quant_train_prob(trie->quant,iVar9,local_78[sVar18 - 1],raw_ngrams[sVar18 - 2]);
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
          ,0x212,"Building LM trie\n");
  local_84 = 0;
  local_4c = *puVar1;
  local_48 = raw_ngrams;
  ppVar10 = priority_queue_create(sVar18,ngram_ord_comparator);
  local_70 = (uint *)__ckd_calloc__(sVar18,4,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                                    ,0x107);
  iVar9 = iVar9 + -1;
  local_58 = CONCAT44(local_58._4_4_,iVar9);
  ptr = (float *)__ckd_calloc__((long)iVar9,4,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                                ,0x108);
  plVar11 = (long *)__ckd_calloc__(1,0x18,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                                   ,0x109);
  ppnVar8 = local_48;
  *(undefined4 *)(plVar11 + 2) = 1;
  *plVar11 = (long)&local_84;
  local_60 = ppVar10;
  priority_queue_add(ppVar10,plVar11);
  local_68 = __ckd_calloc__((long)iVar9,4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                            ,0x10e);
  for (lVar17 = 2; lVar17 <= (long)sVar18; lVar17 = lVar17 + 1) {
    if (local_78[lVar17 + -1] != 0) {
      *(undefined4 *)((long)local_68 + lVar17 * 4 + -8) = 0;
      element = (undefined8 *)
                __ckd_calloc__(1,0x18,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                               ,0x117);
      pnVar3 = ppnVar8[lVar17 + -2];
      element[2] = *(undefined8 *)&pnVar3->order;
      uVar7 = *(undefined8 *)&pnVar3->prob;
      *element = pnVar3->words;
      element[1] = uVar7;
      *(int *)(element + 2) = (int)lVar17;
      priority_queue_add(local_60,element);
    }
  }
  local_38 = (ulong)((int)local_80 == 2) * 0x10 + 0x18;
  local_40 = local_58 & 0xffffffff;
  ppVar10 = local_60;
  do {
    while( true ) {
      plVar11 = (long *)priority_queue_poll(ppVar10);
      uVar12 = *(uint *)(plVar11 + 2);
      if (uVar12 != 1) break;
      puVar4 = trie->unigrams;
      puVar4[local_84].next =
           *(uint32 *)(*(long *)((long)trie->backoff_cache + local_38 + -0x38) + 0x10);
      *local_70 = local_84;
      *ptr = puVar4[local_84].prob;
      uVar12 = local_84 + 1;
      bVar19 = local_84 == local_4c;
      local_84 = uVar12;
      if (bVar19) {
        ckd_free(plVar11);
        sVar18 = priority_queue_size(ppVar10);
        if (sVar18 == 0) {
          priority_queue_free(ppVar10,(_func_void_void_ptr *)0x0);
          ckd_free(local_68);
          ckd_free(local_70);
          ckd_free(ptr);
          middle = trie->middle_begin;
          pmVar14 = trie->middle_end;
          if (middle != pmVar14) {
            for (; middle != pmVar14 + -1; middle = middle + 1) {
              middle_finish_loading(middle,middle[1].base.insert_index);
              pmVar14 = trie->middle_end;
            }
            middle_finish_loading(pmVar14 + -1,(trie->longest->base).insert_index);
          }
          return;
        }
        __assert_fail("priority_queue_size(ngrams) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                      ,0x160,"void recursive_insert(lm_trie_t *, ngram_raw_t **, uint32 *, int)");
      }
LAB_001109e9:
      priority_queue_add(ppVar10,plVar11);
    }
    uVar15 = 0xffffffffffffffd0;
    for (uVar13 = 0; uVar13 < uVar12 - 1; uVar13 = uVar13 + 1) {
      lVar17 = *plVar11;
      local_58 = uVar15;
      if (local_70[uVar13] != *(uint *)(lVar17 + uVar13 * 4)) {
        uVar16 = uVar13;
        if (uVar13 == 0) {
          __assert_fail("i > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                        ,0x131,"void recursive_insert(lm_trie_t *, ngram_raw_t **, uint32 *, int)");
        }
        for (; uVar16 < uVar12 - 1; uVar16 = uVar16 + 1) {
          bVar20 = middle_insert((middle_t *)(&(trie->middle_begin->base).word_bits + uVar15),
                                 *(uint32 *)(*plVar11 + uVar16 * 4),(int)lVar17,uVar12 - 1);
          prob_00 = ptr[uVar16 - 1] + trie->unigrams[*(uint *)(*plVar11 + uVar16 * 4)].bo;
          ptr[uVar16] = prob_00;
          lm_trie_quant_mwrite(trie->quant,bVar20,(int)uVar16 + -1,(float32)prob_00,0.0);
          uVar12 = *(uint *)(plVar11 + 2);
          uVar15 = uVar15 + 0x30;
          lVar17 = extraout_RDX;
        }
      }
      uVar15 = local_58 + 0x30;
    }
    memcpy(local_70,(void *)*plVar11,(ulong)uVar12 << 2);
    iVar9 = (int)plVar11[2];
    if (iVar9 == (int)local_80) {
      plVar5 = trie->longest;
      uVar12 = *(uint *)(*plVar11 + local_40 * 4);
      if ((plVar5->base).word_mask < uVar12) {
        __assert_fail("index <= longest->base.word_mask",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                      ,0x99,"bitarr_address_t longest_insert(longest_t *, uint32)");
      }
      puVar6 = (plVar5->base).base;
      iVar9 = (uint)(plVar5->base).total_bits * (plVar5->base).insert_index;
      address.offset = iVar9;
      address.base = puVar6;
      address._12_4_ = 0;
      bitarr_write_int25(address,(plVar5->base).word_bits,uVar12);
      puVar1 = &(plVar5->base).insert_index;
      *puVar1 = *puVar1 + 1;
      bVar20.offset = (uint)(plVar5->base).word_bits + iVar9;
      bVar20.base = puVar6;
      bVar20._12_4_ = 0;
      lm_trie_quant_lwrite(trie->quant,bVar20,*(float32 *)(plVar11 + 1));
    }
    else {
      bVar20 = middle_insert(trie->middle_begin + (iVar9 - 2),
                             *(uint32 *)(*plVar11 + (ulong)(iVar9 - 1) * 4),order_00,(int)*plVar11);
      prob = *(float32 *)(plVar11 + 1);
      lVar17 = plVar11[2];
      ptr[(int)lVar17 - 1] = (float)prob;
      lm_trie_quant_mwrite
                (trie->quant,bVar20,(int)lVar17 + -2,prob,*(float32 *)((long)plVar11 + 0xc));
    }
    ppVar10 = local_60;
    piVar2 = (int *)((long)local_68 + (ulong)((int)plVar11[2] - 2) * 4);
    *piVar2 = *piVar2 + 1;
    uVar15 = (ulong)((int)plVar11[2] - 2);
    uVar12 = *(uint *)((long)local_68 + uVar15 * 4);
    if (uVar12 < local_78[(int)plVar11[2] - 1]) {
      pnVar3 = local_48[uVar15];
      plVar11[2] = *(long *)&pnVar3[uVar12].order;
      pnVar3 = pnVar3 + uVar12;
      lVar17 = *(long *)&pnVar3->prob;
      *plVar11 = (long)pnVar3->words;
      plVar11[1] = lVar17;
      goto LAB_001109e9;
    }
    ckd_free(plVar11);
  } while( true );
}

Assistant:

void
lm_trie_build(lm_trie_t * trie, ngram_raw_t ** raw_ngrams, uint32 * counts, uint32 *out_counts,
              int order)
{
    int i;

    lm_trie_fix_counts(raw_ngrams, counts, out_counts, order);
    lm_trie_alloc_ngram(trie, out_counts, order);
    
    if (order > 1)
        E_INFO("Training quantizer\n");
    for (i = 2; i < order; i++) {
        lm_trie_quant_train(trie->quant, i, counts[i - 1],
                            raw_ngrams[i - 2]);
    }
    lm_trie_quant_train_prob(trie->quant, order, counts[order - 1],
                             raw_ngrams[order - 2]);

    E_INFO("Building LM trie\n");
    recursive_insert(trie, raw_ngrams, counts, order);
    /* Set ending offsets so the last entry will be sized properly */
    /* Last entry for unigrams was already set. */
    if (trie->middle_begin != trie->middle_end) {
        middle_t *middle_ptr;
        for (middle_ptr = trie->middle_begin;
             middle_ptr != trie->middle_end - 1; ++middle_ptr) {
            middle_t *next_middle_ptr = middle_ptr + 1;
            middle_finish_loading(middle_ptr,
                                  next_middle_ptr->base.insert_index);
        }
        middle_ptr = trie->middle_end - 1;
        middle_finish_loading(middle_ptr,
                              trie->longest->base.insert_index);
    }
}